

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPf.c
# Opt level: O0

void Pf_StoDelete(Pf_Man_t *p)

{
  Pf_Man_t *p_local;
  
  Vec_PtrFreeData(&p->vPages);
  if ((p->vPages).pArray != (void **)0x0) {
    free((p->vPages).pArray);
    (p->vPages).pArray = (void **)0x0;
  }
  if ((p->vCutSets).pArray != (int *)0x0) {
    free((p->vCutSets).pArray);
    (p->vCutSets).pArray = (int *)0x0;
  }
  if ((p->vCutFlows).pArray != (float *)0x0) {
    free((p->vCutFlows).pArray);
    (p->vCutFlows).pArray = (float *)0x0;
  }
  if ((p->vCutDelays).pArray != (int *)0x0) {
    free((p->vCutDelays).pArray);
    (p->vCutDelays).pArray = (int *)0x0;
  }
  if (p->pPfObjs != (Pf_Obj_t *)0x0) {
    free(p->pPfObjs);
    p->pPfObjs = (Pf_Obj_t *)0x0;
  }
  Vec_WecFree(p->vTt2Match);
  Vec_MemHashFree(p->vTtMem);
  Vec_MemFree(p->vTtMem);
  if (p->pCells != (Mio_Cell_t *)0x0) {
    free(p->pCells);
    p->pCells = (Mio_Cell_t *)0x0;
  }
  if (p != (Pf_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Pf_StoDelete( Pf_Man_t * p )
{
    Vec_PtrFreeData( &p->vPages );
    ABC_FREE( p->vPages.pArray );
    ABC_FREE( p->vCutSets.pArray );
    ABC_FREE( p->vCutFlows.pArray );
    ABC_FREE( p->vCutDelays.pArray );
    ABC_FREE( p->pPfObjs );
    // matching
    Vec_WecFree( p->vTt2Match );
    Vec_MemHashFree( p->vTtMem );
    Vec_MemFree( p->vTtMem );
    ABC_FREE( p->pCells );
    ABC_FREE( p );
}